

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O1

Token __thiscall
slang::parsing::NumberParser::finishValue
          (NumberParser *this,Token firstToken,bool singleToken,bool isNegated)

{
  SVInt *this_00;
  SourceLocation location;
  BumpAllocator *pBVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  bitwidth_t bits;
  __extent_storage<18446744073709551615UL> in_R9;
  bitwidth_t bVar2;
  undefined8 uVar3;
  Info *pIVar4;
  Token TVar5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar6;
  span<const_slang::logic_t,_18446744073709551615UL> digits;
  SVInt result;
  anon_class_16_2_3c4fafbd checkOverflow;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_a8;
  uint local_a0;
  ushort local_9c;
  bool local_91;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_90;
  uint local_88;
  undefined1 uStack_84;
  byte bStack_83;
  undefined2 uStack_82;
  string_view local_80;
  Token local_70 [2];
  anon_class_16_2_3c4fafbd local_50;
  pointer local_40;
  size_type sStack_38;
  
  local_70[0].info = firstToken.info;
  local_70[0]._0_8_ = firstToken._0_8_;
  local_50.isNegated = &local_91;
  local_91 = isNegated;
  local_50.this = this;
  if (this->valid == false) {
    pBVar1 = this->alloc;
    sVar6 = Token::trivia(local_70);
    if (singleToken) {
      local_80 = Token::rawText(local_70);
    }
    else {
      local_80._M_str._0_4_ =
           SmallVectorBase<char>::copy
                     (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                      (EVP_PKEY_CTX *)sVar6._M_extent._M_extent_value._M_extent_value);
      local_80._M_str._4_4_ = extraout_var;
      local_80._M_len = extraout_RDX;
    }
    location = this->firstLocation;
    SVInt::SVInt<int>((SVInt *)&local_a8,0);
    Token::Token((Token *)&local_90,pBVar1,IntegerLiteral,sVar6,local_80,location,(SVInt *)&local_a8
                );
    if (((0x40 < local_a0) || ((local_9c & 0x100) != 0)) && ((void *)local_a8.val != (void *)0x0)) {
      operator_delete__(local_a8.pVal);
    }
    uVar3 = CONCAT71(local_90.val._1_7_,local_90.val._0_1_);
    pIVar4 = (Info *)CONCAT26(uStack_82,CONCAT15(bStack_83,CONCAT14(uStack_84,local_88)));
    goto LAB_0047682b;
  }
  if ((this->literalBase == 2) && (this->hasUnknown == false)) {
    this_00 = &this->decimalValue;
    bVar2 = (this->decimalValue).super_SVIntStorage.bitWidth;
    bits = (bitwidth_t)this_00;
    if (this->signFlag == true) {
      bVar2 = bVar2 + 1;
      SVInt::resize((SVInt *)&local_90,bits);
      SVInt::operator=(this_00,(SVInt *)&local_90);
      if (((0x40 < local_88) || ((bStack_83 & 1) != 0)) &&
         ((void *)CONCAT71(local_90.val._1_7_,local_90.val._0_1_) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_90.val._1_7_,local_90.val._0_1_));
      }
    }
    local_a8.val = 0;
    local_a0 = 1;
    local_9c = 0;
    if (this->sizeBits == 0) {
      if (0x1f < bVar2) goto LAB_00476600;
      SVInt::resize((SVInt *)&local_90,bits);
      SVInt::operator=((SVInt *)&local_a8,(SVInt *)&local_90);
      if (((0x40 < local_88) || ((bStack_83 & 1) != 0)) &&
         ((void *)CONCAT71(local_90.val._1_7_,local_90.val._0_1_) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_90.val._1_7_,local_90.val._0_1_));
      }
    }
    else if (bVar2 == this->sizeBits) {
LAB_00476600:
      SVInt::operator=((SVInt *)&local_a8,this_00);
    }
    else {
      SVInt::resize((SVInt *)&local_90,bits);
      SVInt::operator=((SVInt *)&local_a8,(SVInt *)&local_90);
      if (((0x40 < local_88) || ((bStack_83 & 1) != 0)) &&
         ((void *)CONCAT71(local_90.val._1_7_,local_90.val._0_1_) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_90.val._1_7_,local_90.val._0_1_));
      }
      if (this->sizeBits < bVar2) {
        finishValue::anon_class_16_2_3c4fafbd::operator()(&local_50,bVar2,(SVInt *)&local_a8);
      }
    }
    local_9c = CONCAT11(local_9c._1_1_,this->signFlag);
    pBVar1 = this->alloc;
    sVar6 = Token::trivia(local_70);
    if (singleToken) {
      local_80 = Token::rawText(local_70);
    }
    else {
      local_80._M_str._0_4_ =
           SmallVectorBase<char>::copy
                     (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                      (EVP_PKEY_CTX *)sVar6._M_extent._M_extent_value._M_extent_value);
      local_80._M_str._4_4_ = extraout_var_00;
      local_80._M_len = extraout_RDX_00;
    }
    Token::Token((Token *)&local_90,pBVar1,IntegerLiteral,sVar6,local_80,this->firstLocation,
                 (SVInt *)&local_a8);
  }
  else {
    if ((this->digits).super_SmallVectorBase<slang::logic_t>.len != 0) {
      TVar5 = (Token)(*(code *)(&DAT_0056aa1c +
                               *(int *)(&DAT_0056aa1c + (ulong)(uint)this->literalBase * 4)))();
      return TVar5;
    }
    local_90.val._0_1_ = 0;
    SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t>
              (&(this->digits).super_SmallVectorBase<slang::logic_t>,(logic_t *)&local_90);
    bVar2 = 0x20;
    if (this->sizeBits != 0) {
      bVar2 = this->sizeBits;
    }
    digits._M_ptr = (pointer)(ulong)this->hasUnknown;
    local_40 = (this->digits).super_SmallVectorBase<slang::logic_t>.data_;
    sStack_38 = (this->digits).super_SmallVectorBase<slang::logic_t>.len;
    digits._M_extent._M_extent_value = in_R9._M_extent_value;
    SVInt::fromDigits((bitwidth_t)&local_a8,(LiteralBase)bVar2,(bool)this->literalBase,
                      this->signFlag,digits);
    pBVar1 = this->alloc;
    sVar6 = Token::trivia(local_70);
    if (singleToken) {
      local_80 = Token::rawText(local_70);
    }
    else {
      local_80._M_str._0_4_ =
           SmallVectorBase<char>::copy
                     (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                      (EVP_PKEY_CTX *)sVar6._M_extent._M_extent_value._M_extent_value);
      local_80._M_str._4_4_ = extraout_var_01;
      local_80._M_len = extraout_RDX_01;
    }
    Token::Token((Token *)&local_90,pBVar1,IntegerLiteral,sVar6,local_80,this->firstLocation,
                 (SVInt *)&local_a8);
  }
  uVar3 = CONCAT71(local_90.val._1_7_,local_90.val._0_1_);
  pIVar4 = (Info *)CONCAT26(uStack_82,CONCAT15(bStack_83,CONCAT14(uStack_84,local_88)));
  if (((0x40 < local_a0) || ((local_9c & 0x100) != 0)) && ((void *)local_a8.val != (void *)0x0)) {
    operator_delete__(local_a8.pVal);
  }
LAB_0047682b:
  TVar5.info = pIVar4;
  TVar5.kind = (short)uVar3;
  TVar5._2_1_ = (char)((ulong)uVar3 >> 0x10);
  TVar5.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
  TVar5.rawLen = (int)((ulong)uVar3 >> 0x20);
  return TVar5;
}

Assistant:

Token NumberParser::finishValue(Token firstToken, bool singleToken, bool isNegated) {
    auto createResult = [&](auto&& val) {
        return Token(alloc, TokenKind::IntegerLiteral, firstToken.trivia(),
                     singleToken ? firstToken.rawText() : toStringView(text.copy(alloc)),
                     firstLocation, std::forward<decltype(val)>(val));
    };

    auto checkOverflow = [&](bitwidth_t computedWidth, const SVInt& value) {
        // Special case to avoid the warning when we have a minus operator preceeding
        // a min value signed negative integer, with no unknowns.
        if (isNegated && signFlag && !hasUnknown && computedWidth == sizeBits + 1 &&
            value.isNegative() && value.countOnes() == 1) {
            return;
        }

        addDiag(diag::VectorLiteralOverflow, firstLocation) << computedWidth;
    };

    if (!valid)
        return createResult(0);

    if (literalBase == LiteralBase::Decimal && !hasUnknown) {
        // If we added an x or z, we will fall through to the general handler below.
        // Otherwise, optimize for this case by reusing the integer value already
        // computed by the token itself.
        bitwidth_t width = decimalValue.getBitWidth();
        if (signFlag) {
            width++;
            decimalValue = decimalValue.resize(width);
        }

        // If no size was specified, just return the value as-is. Otherwise,
        // resize it to match the desired size. Warn if that will truncate.
        SVInt result;
        if (!sizeBits) {
            // Unsized numbers are required to be at least 32 bits by the spec.
            if (width < 32)
                result = decimalValue.resize(32);
            else
                result = std::move(decimalValue);
        }
        else if (width != sizeBits) {
            result = decimalValue.resize(sizeBits);
            if (width > sizeBits)
                checkOverflow(width, result);
        }
        else {
            result = std::move(decimalValue);
        }

        result.setSigned(signFlag);
        return createResult(std::move(result));
    }

    if (digits.empty()) {
        digits.push_back(logic_t(0));
    }
    else if (literalBase != LiteralBase::Decimal) {
        uint32_t multiplier = 0;
        switch (literalBase) {
            case LiteralBase::Binary:
                multiplier = 1;
                break;
            case LiteralBase::Octal:
                multiplier = 3;
                break;
            case LiteralBase::Hex:
                multiplier = 4;
                break;
            default:
                SLANG_UNREACHABLE;
        }

        // All of the digits in the number require `multiplier` bits, except for
        // possibly the first (leading) digit. This one has leading zeros in it,
        // so only requires clog2(d+1) bits.
        bitwidth_t bits = 0;
        if (digits.size() > 1)
            bits = bitwidth_t(digits.size() - 1) * multiplier;

        // If the leading digit is unknown however, allow any size.
        if (!digits[0].isUnknown())
            bits += (bitwidth_t)std::bit_width(digits[0].value);

        if (bits > sizeBits) {
            if (sizeBits == 0) {
                if (bits > SVInt::MAX_BITS) {
                    bits = SVInt::MAX_BITS;
                    addDiag(diag::LiteralSizeTooLarge, firstLocation) << (int)SVInt::MAX_BITS;
                }

                sizeBits = std::max(32u, bits);
            }
            else {
                auto result = SVInt::fromDigits(sizeBits, literalBase, signFlag, hasUnknown,
                                                digits);
                checkOverflow(bits, result);
                return createResult(std::move(result));
            }
        }
    }

    return createResult(
        SVInt::fromDigits(sizeBits ? sizeBits : 32, literalBase, signFlag, hasUnknown, digits));
}